

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Moira.cpp
# Opt level: O2

u16 __thiscall moira::Moira::getSR(Moira *this)

{
  u8 uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [16];
  ulong uVar10;
  undefined1 auVar11 [15];
  unkuint9 Var12;
  undefined1 auVar13 [11];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  u8 uVar16;
  undefined1 auVar17 [16];
  undefined4 uVar18;
  
  uVar10._0_1_ = (this->reg).sr.t1;
  uVar10._1_1_ = (this->reg).sr.t0;
  uVar10._2_1_ = (this->reg).sr.s;
  uVar10._3_1_ = (this->reg).sr.m;
  uVar10._4_1_ = (this->reg).sr.x;
  uVar10._5_1_ = (this->reg).sr.n;
  uVar10._6_1_ = (this->reg).sr.z;
  uVar10._7_1_ = (this->reg).sr.v;
  auVar2._8_6_ = 0;
  auVar2._0_8_ = uVar10;
  auVar2[0xe] = uVar10._7_1_;
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar10;
  auVar3[0xc] = uVar10._6_1_;
  auVar3._13_2_ = auVar2._13_2_;
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar10;
  auVar4._12_3_ = auVar3._12_3_;
  auVar5._8_2_ = 0;
  auVar5._0_8_ = uVar10;
  auVar5[10] = uVar10._5_1_;
  auVar5._11_4_ = auVar4._11_4_;
  auVar6._8_2_ = 0;
  auVar6._0_8_ = uVar10;
  auVar6._10_5_ = auVar5._10_5_;
  auVar7[8] = uVar10._4_1_;
  auVar7._0_8_ = uVar10;
  auVar7._9_6_ = auVar6._9_6_;
  auVar11._7_8_ = 0;
  auVar11._0_7_ = auVar7._8_7_;
  Var12 = CONCAT81(SUB158(auVar11 << 0x40,7),uVar10._3_1_);
  auVar14._9_6_ = 0;
  auVar14._0_9_ = Var12;
  auVar13._1_10_ = SUB1510(auVar14 << 0x30,5);
  auVar13[0] = uVar10._2_1_;
  auVar15._11_4_ = 0;
  auVar15._0_11_ = auVar13;
  auVar8[2] = uVar10._1_1_;
  auVar8._0_2_ = (short)uVar10;
  auVar8._3_12_ = SUB1512(auVar15 << 0x20,3);
  uVar1 = (this->reg).sr.ipl;
  uVar16 = getCCR(this);
  uVar10 = CONCAT26((short)Var12 * 0x1000,
                    CONCAT24(auVar13._0_2_ * 0x2000,
                             CONCAT22(auVar8._2_2_ * 0x4000,(short)uVar10 * -0x8000)));
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar10;
  uVar18 = (undefined4)(uVar10 >> 0x20);
  auVar17._4_4_ = uVar18;
  auVar17._0_4_ = uVar18;
  auVar17._8_4_ = uVar18;
  auVar17._12_4_ = uVar18;
  return SUB162(auVar17 | auVar9,2) | SUB162(auVar17 | auVar9,0) | CONCAT11(uVar1,uVar16);
}

Assistant:

u16
Moira::getSR() const
{
    auto flags =
    reg.sr.t1  << 15 |
    reg.sr.t0  << 14 |
    reg.sr.s   << 13 |
    reg.sr.m   << 12 |
    reg.sr.ipl <<  8 ;

    return u16(flags | getCCR());
}